

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O1

jsgf_t * jsgf_parse_string(char *string,jsgf_t *parent)

{
  int iVar1;
  YY_BUFFER_STATE b;
  jsgf_t *jsgf;
  yyscan_t yyscanner;
  yyscan_t local_20;
  
  yylex_init(&local_20);
  b = yy_scan_string(string,local_20);
  jsgf = jsgf_grammar_new(parent);
  if (parent == (jsgf_t *)0x0) {
    jsgf_set_search_path(jsgf,(char *)0x0);
  }
  iVar1 = yyparse(local_20,jsgf);
  if (iVar1 == 0) {
    yy_delete_buffer(b,local_20);
  }
  else {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
            ,0x37d,"Failed to parse JSGF grammar from input string\n");
    jsgf_grammar_free(jsgf);
    yy_delete_buffer(b,local_20);
    jsgf = (jsgf_t *)0x0;
  }
  yylex_destroy(local_20);
  return jsgf;
}

Assistant:

jsgf_t *
jsgf_parse_string(const char *string, jsgf_t * parent)
{
    yyscan_t yyscanner;
    jsgf_t *jsgf;
    int yyrv;
    YY_BUFFER_STATE buf;

    yylex_init(&yyscanner);
    buf = yy_scan_string(string, yyscanner);

    jsgf = jsgf_grammar_new(parent);
    if (!parent)
        jsgf_set_search_path(jsgf, NULL);

    yyrv = yyparse(yyscanner, jsgf);
    if (yyrv != 0) {
        E_ERROR("Failed to parse JSGF grammar from input string\n");
        jsgf_grammar_free(jsgf);
        yy_delete_buffer(buf, yyscanner);
        yylex_destroy(yyscanner);
        return NULL;
    }
    yy_delete_buffer(buf, yyscanner);
    yylex_destroy(yyscanner);

    return jsgf;
}